

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_read_binary_le(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  ulong *puVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  size_t nblimbs;
  
  nblimbs = ((buflen >> 3) + 1) - (ulong)((buflen & 7) == 0);
  if (X->n != nblimbs) {
    mbedtls_mpi_free(X);
    X->s = 1;
    X->n = 0;
    X->p = (mbedtls_mpi_uint *)0x0;
    iVar2 = mbedtls_mpi_grow(X,nblimbs);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  iVar2 = mbedtls_mpi_lset(X,0);
  if (iVar2 == 0) {
    iVar2 = 0;
    bVar3 = 0;
    for (uVar4 = 0; buflen != uVar4; uVar4 = uVar4 + 1) {
      puVar1 = (ulong *)((long)X->p + (uVar4 & 0xfffffffffffffff8));
      *puVar1 = *puVar1 | (ulong)buf[uVar4] << (bVar3 & 0x38);
      bVar3 = bVar3 + 8;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_read_binary_le( mbedtls_mpi *X,
                                const unsigned char *buf, size_t buflen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    size_t const limbs = CHARS_TO_LIMBS( buflen );

    /* Ensure that target MPI has exactly the necessary number of limbs */
    if( X->n != limbs )
    {
        mbedtls_mpi_free( X );
        mbedtls_mpi_init( X );
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, limbs ) );
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    for( i = 0; i < buflen; i++ )
        X->p[i / ciL] |= ((mbedtls_mpi_uint) buf[i]) << ((i % ciL) << 3);

cleanup:

    /*
     * This function is also used to import keys. However, wiping the buffers
     * upon failure is not necessary because failure only can happen before any
     * input is copied.
     */
    return( ret );
}